

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_graph_get_tensor(ggml_cgraph *cgraph,char *name)

{
  ggml_tensor **ppgVar1;
  ggml_tensor *pgVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ggml_tensor *unaff_RBX;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  uVar7 = (ulong)cgraph->n_leafs;
  bVar9 = 0 < (long)uVar7;
  if (0 < (long)uVar7) {
    ppgVar1 = cgraph->leafs;
    pgVar2 = *ppgVar1;
    iVar4 = strcmp(pgVar2->name,name);
    unaff_RBX = pgVar2;
    if (iVar4 != 0) {
      uVar3 = 1;
      do {
        uVar6 = uVar3;
        unaff_RBX = pgVar2;
        if (uVar7 == uVar6) break;
        unaff_RBX = ppgVar1[uVar6];
        iVar4 = strcmp(unaff_RBX->name,name);
        uVar3 = uVar6 + 1;
      } while (iVar4 != 0);
      bVar9 = uVar6 < uVar7;
    }
  }
  if (!bVar9) {
    iVar4 = cgraph->n_nodes;
    if (0 < (long)iVar4) {
      ppgVar1 = cgraph->nodes;
      lVar8 = 0;
      do {
        pgVar2 = ppgVar1[lVar8];
        iVar5 = strcmp(pgVar2->name,name);
        if (iVar5 == 0) {
          return pgVar2;
        }
        lVar8 = lVar8 + 1;
      } while (iVar4 != lVar8);
    }
    unaff_RBX = (ggml_tensor *)0x0;
  }
  return unaff_RBX;
}

Assistant:

struct ggml_tensor * ggml_graph_get_tensor(const struct ggml_cgraph * cgraph, const char * name) {
    for (int i = 0; i < cgraph->n_leafs; i++) {
        struct ggml_tensor * leaf = cgraph->leafs[i];

        if (strcmp(leaf->name, name) == 0) {
            return leaf;
        }
    }

    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        if (strcmp(node->name, name) == 0) {
            return node;
        }
    }

    return NULL;
}